

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O3

void __thiscall glcts::CubeMapArrayDataStorage::deinit(CubeMapArrayDataStorage *this)

{
  if (this->m_data_array != (GLubyte *)0x0) {
    operator_delete__(this->m_data_array);
    this->m_data_array = (GLubyte *)0x0;
  }
  this->m_width = 0;
  this->m_depth = 0;
  this->m_height = 0;
  return;
}

Assistant:

void CubeMapArrayDataStorage::deinit(void)
{
	if (m_data_array != DE_NULL)
	{
		delete[] m_data_array;

		m_data_array = DE_NULL;
	}

	m_width  = 0;
	m_height = 0;
	m_depth  = 0;
}